

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Symbol(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,Static_String *t_s,bool t_disallow_prevention)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  size_t sVar10;
  string_view t_str;
  string_view t_str_00;
  Depth_Counter dc;
  int iStack_50;
  Position local_48;
  
  Depth_Counter::Depth_Counter(&dc,this);
  SkipWS(this,false);
  iVar5 = (this->m_position).line;
  iVar6 = (this->m_position).col;
  pcVar1 = (this->m_position).m_pos;
  pcVar3 = (this->m_position).m_end;
  uVar4 = *(undefined8 *)&(this->m_position).m_last_col;
  bVar7 = Symbol_(this,t_s);
  if (bVar7) {
    pbVar2 = (byte *)(this->m_position).m_pos;
    bVar7 = true;
    if ((pbVar2 == (byte *)(this->m_position).m_end || t_disallow_prevention) ||
       (m_alphabet._M_elems[0]._M_elems[*pbVar2] != true)) goto LAB_0038dc56;
    if (*pbVar2 != 0x3d) {
      sVar10 = (long)pbVar2 - (long)pcVar1;
      if (pcVar1 == (char *)0x0) {
        sVar10 = 0;
      }
      t_str._M_str = pcVar1;
      t_str._M_len = sVar10;
      bVar8 = Operator_Matches::is_match(&m_operator_matches,t_str);
      if (bVar8) {
        Position::operator+(&local_48,&this->m_position,1);
        if ((pcVar1 == (char *)0x0) || (local_48.m_pos == (char *)0x0)) {
          sVar10 = 0;
          pcVar9 = (char *)0x0;
        }
        else {
          sVar10 = (long)local_48.m_pos - (long)pcVar1;
          pcVar9 = pcVar1;
        }
        t_str_00._M_str = pcVar9;
        t_str_00._M_len = sVar10;
        bVar8 = Operator_Matches::is_match(&m_operator_matches,t_str_00);
        if (!bVar8) goto LAB_0038dc56;
      }
    }
    (this->m_position).line = iVar5;
    (this->m_position).col = iVar6;
    (this->m_position).m_pos = pcVar1;
    iStack_50 = (int)uVar4;
    (this->m_position).m_last_col = iStack_50;
    (this->m_position).m_end = pcVar3;
  }
  bVar7 = false;
LAB_0038dc56:
  (dc.parser)->m_current_parse_depth = (dc.parser)->m_current_parse_depth - 1;
  return bVar7;
}

Assistant:

bool Symbol(const utility::Static_String &t_s, const bool t_disallow_prevention = false) {
        Depth_Counter dc{this};
        SkipWS();
        const auto start = m_position;
        bool retval = Symbol_(t_s);

        // ignore substring matches
        if (retval && m_position.has_more() && (t_disallow_prevention == false) && char_in_alphabet(*m_position, detail::symbol_alphabet)) {
          if (*m_position != '=' && is_operator(Position::str(start, m_position)) && !is_operator(Position::str(start, m_position + 1))) {
            // don't throw this away, it's a good match and the next is not
          } else {
            m_position = start;
            retval = false;
          }
        }

        return retval;
      }